

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,void>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>
          *alloc_ref)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ctrl_t *pcVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (this->old_capacity_ != 0) {
        pcVar3 = (this->old_heap_or_soo_).heap.control;
        lVar4 = *(long *)((long)&this->old_heap_or_soo_ + 8);
        pvVar5 = (c->heap_or_soo_).heap.slot_array.p;
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (kSentinel < pcVar3[uVar10]) {
            puVar1 = (undefined8 *)((long)pvVar5 + lVar9 + 0x20);
            puVar2 = (undefined8 *)(lVar4 + lVar9);
            uVar6 = *puVar2;
            uVar7 = puVar2[1];
            puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar9);
            uVar8 = puVar2[1];
            puVar1[2] = *puVar2;
            puVar1[3] = uVar8;
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < this->old_capacity_);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }